

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# page_heap.cc
# Opt level: O0

bool __thiscall
tcmalloc::PageHeap::CheckSet(PageHeap *this,SpanSet *spanset,Length min_pages,int freelist)

{
  Length LVar1;
  LogItem b;
  LogItem b_00;
  LogItem b_01;
  LogItem b_02;
  LogItem b_03;
  LogItem c;
  LogItem c_00;
  LogItem c_01;
  LogItem c_02;
  LogItem c_03;
  LogItem d;
  LogItem d_00;
  LogItem d_01;
  LogItem d_02;
  LogItem d_03;
  bool bVar2;
  pointer pSVar3;
  ulong uVar4;
  LogItem a;
  LogItem a_00;
  LogItem a_01;
  LogItem a_02;
  LogItem a_03;
  LogItem local_1f0;
  LogItem local_1e0;
  LogItem local_1d0;
  LogItem local_1c0;
  LogItem local_1b0;
  LogItem local_1a0;
  LogItem local_190;
  LogItem local_180;
  LogItem local_170;
  LogItem local_160;
  LogItem local_150;
  LogItem local_140;
  LogItem local_130;
  LogItem local_120;
  LogItem local_110;
  LogItem local_100;
  LogItem local_f0;
  LogItem local_e0;
  LogItem local_d0;
  LogItem local_c0;
  Span *local_b0;
  Span *s;
  _Self local_a0;
  SpanSetIter it;
  int freelist_local;
  Length min_pages_local;
  SpanSet *spanset_local;
  PageHeap *this_local;
  Number i2;
  Number i1;
  Span *local_38;
  Number i2_1;
  Number i1_1;
  Span *local_10;
  
  it._M_node._4_4_ = freelist;
  local_a0._M_node =
       (_Base_ptr)
       std::
       set<tcmalloc::SpanPtrWithLength,_tcmalloc::SpanBestFitLess,_tcmalloc::STLPageHeapAllocator<tcmalloc::SpanPtrWithLength,_void>_>
       ::begin(spanset);
  while( true ) {
    s = (Span *)std::
                set<tcmalloc::SpanPtrWithLength,_tcmalloc::SpanBestFitLess,_tcmalloc::STLPageHeapAllocator<tcmalloc::SpanPtrWithLength,_void>_>
                ::end(spanset);
    bVar2 = std::operator!=(&local_a0,(_Self *)&s);
    if (!bVar2) {
      return true;
    }
    pSVar3 = std::_Rb_tree_const_iterator<tcmalloc::SpanPtrWithLength>::operator->(&local_a0);
    local_b0 = pSVar3->span;
    LVar1 = local_b0->length;
    pSVar3 = std::_Rb_tree_const_iterator<tcmalloc::SpanPtrWithLength>::operator->(&local_a0);
    if (LVar1 != pSVar3->length) {
      LogItem::LogItem(&local_c0,"s->length == it->length");
      LogItem::LogItem(&local_d0);
      LogItem::LogItem(&local_e0);
      LogItem::LogItem(&local_f0);
      a._4_4_ = 0;
      a.tag_ = local_c0.tag_;
      b.u_.str = local_d0.u_.str;
      b.tag_ = local_d0.tag_;
      b._4_4_ = local_d0._4_4_;
      c.u_.str = local_e0.u_.str;
      c.tag_ = local_e0.tag_;
      c._4_4_ = local_e0._4_4_;
      d.u_.str = local_f0.u_.str;
      d.tag_ = local_f0.tag_;
      d._4_4_ = local_f0._4_4_;
      a.u_.str = local_c0.u_.str;
      Log(kCrash,
          "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/page_heap.cc"
          ,0x336,a,b,c,d);
      do {
      } while( true );
    }
    if ((*(uint *)&local_b0->field_0x28 >> 0x18 & 3) != it._M_node._4_4_) {
      LogItem::LogItem(&local_100,"s->location == freelist");
      LogItem::LogItem(&local_110);
      LogItem::LogItem(&local_120);
      LogItem::LogItem(&local_130);
      a_00._4_4_ = 0;
      a_00.tag_ = local_100.tag_;
      b_00.u_.str = local_110.u_.str;
      b_00.tag_ = local_110.tag_;
      b_00._4_4_ = local_110._4_4_;
      c_00.u_.str = local_120.u_.str;
      c_00.tag_ = local_120.tag_;
      c_00._4_4_ = local_120._4_4_;
      d_00.u_.str = local_130.u_.str;
      d_00.tag_ = local_130.tag_;
      d_00._4_4_ = local_130._4_4_;
      a_00.u_.str = local_100.u_.str;
      Log(kCrash,
          "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/page_heap.cc"
          ,0x337,a_00,b_00,c_00,d_00);
      do {
      } while( true );
    }
    if (local_b0->length < min_pages) break;
    uVar4 = local_b0->start;
    if ((uVar4 >> 0x23 == 0) && ((this->pagemap_).root_[uVar4 >> 0x12] != (Leaf *)0x0)) {
      local_38 = (Span *)(this->pagemap_).root_[uVar4 >> 0x12]->values[uVar4 & 0x3ffff];
    }
    else {
      local_38 = (Span *)0x0;
    }
    if (local_38 != local_b0) {
      LogItem::LogItem(&local_180,"GetDescriptor(s->start) == s");
      LogItem::LogItem(&local_190);
      LogItem::LogItem(&local_1a0);
      LogItem::LogItem(&local_1b0);
      a_02._4_4_ = 0;
      a_02.tag_ = local_180.tag_;
      b_02.u_.str = local_190.u_.str;
      b_02.tag_ = local_190.tag_;
      b_02._4_4_ = local_190._4_4_;
      c_02.u_.str = local_1a0.u_.str;
      c_02.tag_ = local_1a0.tag_;
      c_02._4_4_ = local_1a0._4_4_;
      d_02.u_.str = local_1b0.u_.str;
      d_02.tag_ = local_1b0.tag_;
      d_02._4_4_ = local_1b0._4_4_;
      a_02.u_.str = local_180.u_.str;
      Log(kCrash,
          "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/page_heap.cc"
          ,0x339,a_02,b_02,c_02,d_02);
      do {
      } while( true );
    }
    uVar4 = (local_b0->start + local_b0->length) - 1;
    if ((uVar4 >> 0x23 == 0) && ((this->pagemap_).root_[uVar4 >> 0x12] != (Leaf *)0x0)) {
      local_10 = (Span *)(this->pagemap_).root_[uVar4 >> 0x12]->values[uVar4 & 0x3ffff];
    }
    else {
      local_10 = (Span *)0x0;
    }
    if (local_10 != local_b0) {
      LogItem::LogItem(&local_1c0,"GetDescriptor(s->start+s->length-1) == s");
      LogItem::LogItem(&local_1d0);
      LogItem::LogItem(&local_1e0);
      LogItem::LogItem(&local_1f0);
      a_03._4_4_ = 0;
      a_03.tag_ = local_1c0.tag_;
      b_03.u_.str = local_1d0.u_.str;
      b_03.tag_ = local_1d0.tag_;
      b_03._4_4_ = local_1d0._4_4_;
      c_03.u_.str = local_1e0.u_.str;
      c_03.tag_ = local_1e0.tag_;
      c_03._4_4_ = local_1e0._4_4_;
      d_03.u_.str = local_1f0.u_.str;
      d_03.tag_ = local_1f0.tag_;
      d_03._4_4_ = local_1f0._4_4_;
      a_03.u_.str = local_1c0.u_.str;
      Log(kCrash,
          "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/page_heap.cc"
          ,0x33a,a_03,b_03,c_03,d_03);
      do {
      } while( true );
    }
    std::_Rb_tree_const_iterator<tcmalloc::SpanPtrWithLength>::operator++(&local_a0);
  }
  LogItem::LogItem(&local_140,"s->length >= min_pages");
  LogItem::LogItem(&local_150);
  LogItem::LogItem(&local_160);
  LogItem::LogItem(&local_170);
  a_01._4_4_ = 0;
  a_01.tag_ = local_140.tag_;
  b_01.u_.str = local_150.u_.str;
  b_01.tag_ = local_150.tag_;
  b_01._4_4_ = local_150._4_4_;
  c_01.u_.str = local_160.u_.str;
  c_01.tag_ = local_160.tag_;
  c_01._4_4_ = local_160._4_4_;
  d_01.u_.str = local_170.u_.str;
  d_01.tag_ = local_170.tag_;
  d_01._4_4_ = local_170._4_4_;
  a_01.u_.str = local_140.u_.str;
  Log(kCrash,
      "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/page_heap.cc",
      0x338,a_01,b_01,c_01,d_01);
  do {
  } while( true );
}

Assistant:

bool PageHeap::CheckSet(SpanSet* spanset, Length min_pages,int freelist) {
  for (SpanSetIter it = spanset->begin(); it != spanset->end(); ++it) {
    Span* s = it->span;
    CHECK_CONDITION(s->length == it->length);
    CHECK_CONDITION(s->location == freelist);  // NORMAL or RETURNED
    CHECK_CONDITION(s->length >= min_pages);
    CHECK_CONDITION(GetDescriptor(s->start) == s);
    CHECK_CONDITION(GetDescriptor(s->start+s->length-1) == s);
  }
  return true;
}